

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfer.cc
# Opt level: O1

Node __thiscall verona::Infer::do_block(Infer *this,Node *block)

{
  _Rb_tree_header *p_Var1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int **pp_Var3;
  TokenDef *pTVar4;
  _Base_ptr p_Var5;
  NodeDef *pNVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Token *pTVar8;
  int __flags;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *extraout_RDX;
  element_type *extraout_RDX_00;
  element_type *extraout_RDX_01;
  element_type *extraout_RDX_02;
  element_type *extraout_RDX_03;
  element_type *extraout_RDX_04;
  element_type *extraout_RDX_05;
  element_type *extraout_RDX_06;
  element_type *extraout_RDX_07;
  element_type *extraout_RDX_08;
  element_type *extraout_RDX_09;
  element_type *extraout_RDX_10;
  element_type *extraout_RDX_11;
  element_type *extraout_RDX_12;
  element_type *extraout_RDX_13;
  element_type *extraout_RDX_14;
  element_type *extraout_RDX_15;
  element_type *extraout_RDX_16;
  element_type *extraout_RDX_17;
  element_type *extraout_RDX_18;
  element_type *extraout_RDX_19;
  element_type *extraout_RDX_20;
  element_type *extraout_RDX_21;
  element_type *extraout_RDX_22;
  element_type *extraout_RDX_23;
  element_type *extraout_RDX_24;
  element_type *extraout_RDX_25;
  void *__child_stack;
  void *__child_stack_00;
  element_type *extraout_RDX_26;
  element_type *extraout_RDX_27;
  element_type *extraout_RDX_28;
  element_type *extraout_RDX_29;
  element_type *extraout_RDX_30;
  element_type *extraout_RDX_31;
  _func_int *p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  Lookup *__arg;
  Node *arg;
  _func_int *p_Var10;
  element_type *param;
  bool bVar11;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  Node NVar12;
  Btype type;
  Node ret;
  WFLookup sel;
  WFLookup args;
  Lookup l;
  shared_ptr<trieste::NodeDef> stmt;
  Node params;
  WFLookup rhs;
  BtypeDef *local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  Token local_348;
  _func_int *local_340;
  undefined1 local_338 [64];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8;
  NodeDef *local_2f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  Token local_2b8;
  _Base_ptr p_Stack_2b0;
  _Base_ptr local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  Token local_280;
  Node local_278;
  undefined1 local_268 [80];
  undefined1 local_218 [56];
  element_type *local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  NodeDef *local_1d0;
  Btype local_1c8;
  Node local_1b8;
  Node local_1a8;
  Btype local_198;
  Btype local_188;
  Btype local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  Btype local_158;
  Node local_148;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  element_type *local_118;
  element_type *local_110;
  Node local_108;
  Btype local_f8;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  Btype local_d8;
  Node local_c8;
  Btype local_b8;
  Btype local_a8;
  NodeDef *local_98;
  Node local_90;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Node local_60;
  Token local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Node local_40;
  
  pp_Var3 = (_func_int **)(((element_type *)in_RDX._M_pi)->origin_)._M_dataplus._M_p;
  p_Var9 = pp_Var3[0xb];
  p_Var10 = pp_Var3[0xc];
  bVar11 = p_Var9 == p_Var10;
  local_268._40_8_ = this;
  if (!bVar11) {
    local_340 = p_Var10;
    local_218._24_8_ = in_RDX._M_pi;
    do {
      local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)p_Var9;
      local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var9 + 8);
      if (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pTVar4 = ((local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->type_).def;
      if (pTVar4 == (TokenDef *)Bind) {
        local_2d8._0_8_ = Rhs;
        trieste::operator/((WFLookup *)(local_268 + 0x30),&local_278,(Token *)local_2d8);
        local_268._0_8_ = Type;
        trieste::operator/((WFLookup *)(local_338 + 0x18),&local_278,(Token *)local_268);
        this_01 = local_338._40_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_338._40_8_ + 8) = *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_338._40_8_ + 8) = *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_338._40_8_ + 8) = *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_338._40_8_ + 8) = *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
            }
          }
        }
        local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_;
        local_338._56_8_ = local_338._32_8_;
        local_2c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._0_8_ = (element_type *)0x0;
        local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2c8._8_8_ = local_2d8 + 8;
        p_Stack_2b0 = (_Base_ptr)0x0;
        local_358 = (BtypeDef *)0x0;
        __arg = (Lookup *)local_2d8;
        local_2b8.def = (TokenDef *)local_2c8._8_8_;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<verona::BtypeDef,std::allocator<verona::BtypeDef>,std::shared_ptr<trieste::NodeDef>&,std::map<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<verona::BtypeDef>,std::owner_less<void>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>const,std::shared_ptr<verona::BtypeDef>>>>&>
                  (&local_350,&local_358,(allocator<verona::BtypeDef> *)local_338,
                   (shared_ptr<trieste::NodeDef> *)(local_338 + 0x38),
                   (map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
                    *)local_2d8);
        std::
        _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<verona::BtypeDef>_>_>_>
                     *)local_2d8);
        if (local_2f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f8._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_);
        }
        p_Var10 = local_340;
        p_Var5 = *(_Base_ptr *)
                  ((long)&(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                             *)local_268._56_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header + 8)
        ;
        if (p_Var5 == (_Base_ptr)TypeTest) {
          local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_b8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_358;
          local_b8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = local_350._M_pi;
          if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
            }
          }
          check((Infer *)block,&local_a8,&local_b8);
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_05;
          this_03._M_pi =
               local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          in_XMM0_Da = extraout_XMM0_Da_07;
          in_XMM0_Db = extraout_XMM0_Db_07;
          if (local_b8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_06;
            this_03._M_pi =
                 local_a8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            in_XMM0_Da = extraout_XMM0_Da_08;
            in_XMM0_Db = extraout_XMM0_Db_08;
          }
LAB_0022bc9d:
          if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_13;
            in_XMM0_Da = extraout_XMM0_Da_16;
            in_XMM0_Db = extraout_XMM0_Db_16;
          }
        }
        else {
          if (p_Var5 == (_Base_ptr)Cast) {
            local_338._24_8_ = Type;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2d8,(WFLookup *)(local_268 + 0x30),
                       (Token *)(local_338 + 0x18));
            p_Var10 = local_340;
            local_c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_2d8._8_8_;
            local_c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
              }
            }
            local_d8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_358;
            local_d8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_350._M_pi;
            if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_c8,&local_d8);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_10;
            this_02._M_pi =
                 local_c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            in_XMM0_Da = extraout_XMM0_Da_13;
            in_XMM0_Db = extraout_XMM0_Db_13;
            if (local_d8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_11;
              this_02._M_pi =
                   local_c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              in_XMM0_Da = extraout_XMM0_Da_14;
              in_XMM0_Db = extraout_XMM0_Db_14;
            }
LAB_0022bc8b:
            this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
            if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_12;
              this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
              in_XMM0_Da = extraout_XMM0_Da_15;
              in_XMM0_Db = extraout_XMM0_Db_15;
            }
            goto LAB_0022bc9d;
          }
          local_2d8._0_8_ = Move;
          local_2d8._8_8_ = Copy;
          pTVar8 = ::std::
                   __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                             ((Lookup *)local_2d8,(Token *)local_2c8,
                              (_Base_ptr *)
                              ((long)&(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                                         *)local_268._56_8_)->_M_t)._M_impl.super__Rb_tree_header.
                                      _M_header + 8));
          p_Var10 = local_340;
          if (pTVar8 != (Token *)local_2c8) {
            local_e8 = (element_type *)local_268._56_8_;
            local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._64_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._64_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_268._64_8_ + 8) =
                     *(_Atomic_word *)(local_268._64_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_268._64_8_ + 8) =
                     *(_Atomic_word *)(local_268._64_8_ + 8) + 1;
              }
            }
            gamma((verona *)&local_40,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            local_f8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_358;
            local_f8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_350._M_pi;
            if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_40,&local_f8);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_07;
            in_XMM0_Da = extraout_XMM0_Da_09;
            in_XMM0_Db = extraout_XMM0_Db_09;
            if (local_f8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_08;
              in_XMM0_Da = extraout_XMM0_Da_10;
              in_XMM0_Db = extraout_XMM0_Db_10;
            }
            this_03._M_pi = local_e0;
            if (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_09;
              this_03._M_pi = local_e0;
              in_XMM0_Da = extraout_XMM0_Da_11;
              in_XMM0_Db = extraout_XMM0_Db_11;
            }
            goto LAB_0022bc9d;
          }
          p_Var5 = *(_Base_ptr *)
                    ((long)&(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                               *)local_268._56_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header +
                    8);
          if (p_Var5 == (_Base_ptr)FieldRef) {
            local_2d8._0_8_ = TypeView;
            trieste::NodeDef::create((NodeDef *)local_218,(Token *)local_2d8);
            local_348.def = (TokenDef *)Ref;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2d8,(WFLookup *)(local_268 + 0x30),&local_348);
            local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
            local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
              }
            }
            gamma((verona *)&local_118,(double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
            if (local_110 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &(local_110->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var2 = &(local_110->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
              }
            }
            local_338._24_8_ = local_118;
            local_338._32_8_ = local_110;
            if (local_110 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &(local_110->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                UNLOCK();
              }
              else {
                p_Var2 = &(local_110->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                          super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
              }
            }
            local_268._32_8_ = local_110;
            if (local_118 != (element_type *)0x0) {
              ::std::
              vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ::push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           *)(local_218._0_8_ + 0x58),(value_type *)(local_338 + 0x18));
            }
            if ((element_type *)local_338._32_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._32_8_);
            }
            local_98 = (NodeDef *)local_218._0_8_;
            local_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
            local_218._0_8_ = (NodeDef *)0x0;
            local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pNVar6 = block[1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Ident;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)(local_338 + 0x38),(WFLookup *)(local_268 + 0x30),
                       (Token *)&local_48);
            trieste::NodeDef::lookdown
                      ((Nodes *)local_268,pNVar6,(Location *)&local_2f8._M_pi[1]._M_use_count);
            local_50.def = (TokenDef *)Type;
            trieste::operator/((WFLookup *)(local_338 + 0x18),(Node *)local_268._0_8_,&local_50);
            pNVar6 = local_98;
            p_Var10 = local_340;
            local_148.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_338._32_8_;
            local_148.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_338._40_8_ + 8) =
                     *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_338._40_8_ + 8) =
                     *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
              }
            }
            reftype((verona *)&local_138,&local_148);
            local_338._0_8_ = local_138;
            local_338._8_8_ = local_130;
            if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_130->_M_use_count = local_130->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_130->_M_use_count = local_130->_M_use_count + 1;
              }
            }
            trieste::NodeDef::push_back(pNVar6,(Node *)local_338);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
            }
            local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 pNVar6;
            local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_2e0;
            local_158.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_358;
            local_158.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_350._M_pi;
            if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_108,&local_158);
            if (local_158.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_158.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
            }
            if (local_148.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_148.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_);
            }
            ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       *)local_268);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_18;
            in_XMM0_Da = extraout_XMM0_Da_22;
            in_XMM0_Db = extraout_XMM0_Db_22;
            if (local_2f0 != (NodeDef *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_19;
              in_XMM0_Da = extraout_XMM0_Da_23;
              in_XMM0_Db = extraout_XMM0_Db_23;
            }
            if ((element_type *)local_268._32_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._32_8_);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_20;
              in_XMM0_Da = extraout_XMM0_Da_24;
              in_XMM0_Db = extraout_XMM0_Db_24;
            }
            if (local_110 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_21;
              in_XMM0_Da = extraout_XMM0_Da_25;
              in_XMM0_Db = extraout_XMM0_Db_25;
            }
            if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_22;
              in_XMM0_Da = extraout_XMM0_Da_26;
              in_XMM0_Db = extraout_XMM0_Db_26;
            }
            this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_23;
              this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
              in_XMM0_Da = extraout_XMM0_Da_27;
              in_XMM0_Db = extraout_XMM0_Db_27;
            }
            goto LAB_0022bc9d;
          }
          if (p_Var5 == (_Base_ptr)Conditional) {
            local_338._24_8_ = If;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2d8,(WFLookup *)(local_268 + 0x30),
                       (Token *)(local_338 + 0x18));
            p_Var10 = local_340;
            local_168 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
            local_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
              }
            }
            gamma((verona *)&local_60,(double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
            local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = block[3].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,&local_60,&local_178);
            if (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_178.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_);
            }
            local_338._24_8_ = True;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2d8,(WFLookup *)(local_268 + 0x30),
                       (Token *)(local_338 + 0x18));
            do_block((Infer *)(local_80 + 0x10),block);
            local_188.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_358;
            local_188.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_350._M_pi;
            if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,(Node *)(local_80 + 0x10),&local_188);
            if (local_188.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_188.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_);
            }
            local_338._24_8_ = False;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)local_2d8,(WFLookup *)(local_268 + 0x30),
                       (Token *)(local_338 + 0x18));
            do_block((Infer *)local_80,block);
            local_198.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_358;
            local_198.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_350._M_pi;
            if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
              }
            }
            check((Infer *)block,(Node *)local_80,&local_198);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_24;
            this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
            in_XMM0_Da = extraout_XMM0_Da_28;
            in_XMM0_Db = extraout_XMM0_Db_28;
            if (local_198.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_198.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_25;
              this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
              in_XMM0_Da = extraout_XMM0_Da_29;
              in_XMM0_Db = extraout_XMM0_Db_29;
            }
            goto LAB_0022bc8b;
          }
          if (p_Var5 == (_Base_ptr)Call) {
            local_2d8._0_8_ = Selector;
            trieste::wf::detail::WFLookup::operator/
                      ((WFLookup *)(local_338 + 0x18),(WFLookup *)(local_268 + 0x30),
                       (Token *)local_2d8);
            __flags = 0x2dd180;
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_17;
            in_XMM0_Da = extraout_XMM0_Da_21;
            in_XMM0_Db = extraout_XMM0_Db_21;
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_338._32_8_ + 0x10))->
                _vptr__Sp_counted_base == (_func_int **)FQFunction) {
              local_1a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_338._32_8_;
              local_1a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_338._40_8_ + 8) =
                       *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_338._40_8_ + 8) =
                       *(_Atomic_word *)(local_338._40_8_ + 8) + 1;
                }
              }
              resolve_fq((Lookup *)local_2d8,&local_1a8);
              if (local_1a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1a8.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_338._0_8_ = &Params;
              trieste::operator/((WFLookup *)(local_338 + 0x38),(Node *)local_2d8,(Token *)local_338
                                );
              pNVar6 = local_2f0;
              if (local_2f0 != (NodeDef *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var2 = &(local_2f0->super_enable_shared_from_this<trieste::NodeDef>).
                            _M_weak_this.
                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                  UNLOCK();
                }
                else {
                  p_Var2 = &(local_2f0->super_enable_shared_from_this<trieste::NodeDef>).
                            _M_weak_this.
                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                }
              }
              if (local_2f8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_268._0_8_ = (TokenDef *)0x0;
                local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                trieste::NodeDef::clone
                          ((NodeDef *)local_268,(__fn *)local_2f8._M_pi,__child_stack,__flags,__arg)
                ;
              }
              if (pNVar6 != (NodeDef *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar6);
              }
              if (local_2f0 != (NodeDef *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0);
              }
              local_348.def = (TokenDef *)Type;
              trieste::operator/((WFLookup *)(local_338 + 0x38),(Node *)local_2d8,&local_348);
              pNVar6 = local_2f0;
              if (local_2f0 != (NodeDef *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var2 = &(local_2f0->super_enable_shared_from_this<trieste::NodeDef>).
                            _M_weak_this.
                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                  UNLOCK();
                }
                else {
                  p_Var2 = &(local_2f0->super_enable_shared_from_this<trieste::NodeDef>).
                            _M_weak_this.
                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
                }
              }
              if (local_2f8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_338._0_8_ = (element_type *)0x0;
                local_338._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                trieste::NodeDef::clone
                          ((NodeDef *)local_338,(__fn *)local_2f8._M_pi,__child_stack_00,__flags,
                           __arg);
              }
              if (pNVar6 != (NodeDef *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar6);
              }
              if (local_2f0 != (NodeDef *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0);
              }
              local_348.def = (TokenDef *)Args;
              trieste::wf::detail::WFLookup::operator/
                        ((WFLookup *)(local_338 + 0x38),(WFLookup *)(local_268 + 0x30),&local_348);
              Lookup::sub((Lookup *)local_2d8,(Node *)local_268);
              Lookup::sub((Lookup *)local_2d8,(Node *)local_338);
              param = (element_type *)
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &((TokenDef *)(local_268._0_8_ + 0x50))->fl)->_M_pi;
              peVar7 = ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                       &((TokenDef *)(local_268._0_8_ + 0x60))->name)->_M_ptr;
              arg = *(Node **)&local_2f8._M_pi[5]._M_use_count;
              if ((((long)peVar7 - (long)param ==
                    (long)local_2f8._M_pi[6]._vptr__Sp_counted_base - (long)arg) &&
                  (local_348.def = (TokenDef *)block, param != peVar7)) &&
                 (bVar11 = do_block::anon_class_8_1_8991fb9c::operator()
                                     ((anon_class_8_1_8991fb9c *)&local_348,(Node *)param,arg),
                 bVar11)) {
                do {
                  param = (element_type *)&param->type_;
                  arg = arg + 1;
                  if (param == peVar7) break;
                  bVar11 = do_block::anon_class_8_1_8991fb9c::operator()
                                     ((anon_class_8_1_8991fb9c *)&local_348,(Node *)param,arg);
                } while (bVar11);
              }
              local_1b8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_338._0_8_;
              local_1b8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_338._8_8_ + 8) =
                       *(_Atomic_word *)(local_338._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_338._8_8_ + 8) =
                       *(_Atomic_word *)(local_338._8_8_ + 8) + 1;
                }
              }
              local_1c8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_358;
              local_1c8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = local_350._M_pi;
              if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
                }
              }
              check((Infer *)block,&local_1b8,&local_1c8);
              if (local_1c8.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1c8.
                           super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_1b8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1b8.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_2f0 != (NodeDef *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
              ::std::
              _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                           *)local_2c8);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_26;
              in_XMM0_Da = extraout_XMM0_Da_30;
              in_XMM0_Db = extraout_XMM0_Db_30;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
                in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_27;
                in_XMM0_Da = extraout_XMM0_Da_31;
                in_XMM0_Db = extraout_XMM0_Db_31;
              }
            }
            p_Var10 = local_340;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._40_8_);
              in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_28;
              p_Var10 = local_340;
              in_XMM0_Da = extraout_XMM0_Da_32;
              in_XMM0_Db = extraout_XMM0_Db_32;
            }
          }
          else {
            local_2d8._0_8_ = Int;
            local_2d8._8_8_ = Bin;
            local_2c8._0_8_ = Oct;
            local_2c8._8_8_ = Hex;
            local_2b8.def = (TokenDef *)Float;
            p_Stack_2b0 = (_Base_ptr)HexFloat;
            local_2a8 = (_Base_ptr)Char;
            local_2a0 = Escaped;
            local_298 = String;
            local_290 = Tuple;
            local_288 = LLVM;
            pTVar8 = ::std::
                     __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                               ((Lookup *)local_2d8,&local_280,
                                (_Base_ptr *)
                                ((long)&(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                                           *)local_268._56_8_)->_M_t)._M_impl.super__Rb_tree_header.
                                        _M_header + 8));
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04;
            p_Var10 = local_340;
            in_XMM0_Da = extraout_XMM0_Da_06;
            in_XMM0_Db = extraout_XMM0_Db_06;
            if (pTVar8 == &local_280) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                            ,0x84,"Node verona::Infer::do_block(Node &)");
            }
          }
        }
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._64_8_;
        if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_14;
          in_XMM0_Da = extraout_XMM0_Da_17;
          in_XMM0_Db = extraout_XMM0_Db_17;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._64_8_;
        }
joined_r0x0022bcc8:
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_15;
          in_XMM0_Da = extraout_XMM0_Da_18;
          in_XMM0_Db = extraout_XMM0_Db_18;
        }
      }
      else {
        if (pTVar4 == (TokenDef *)Return) {
          if (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              *(element_type **)
               (*(_func_int **)((long)(((string *)local_218._24_8_)->_M_dataplus)._M_p + 0x60) +
               -0x10)) {
            __assert_fail("stmt == block->back()",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                          ,0x89,"Node verona::Infer::do_block(Node &)");
          }
          local_268._48_8_ = Ref;
          trieste::operator/((WFLookup *)local_2d8,&local_278,(Token *)(local_268 + 0x30));
          local_1d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
          local_1d0 = (NodeDef *)local_2c8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(flag *)(local_2c8._0_8_ + 8) = *(flag *)(local_2c8._0_8_ + 8) + 1;
            }
          }
          gamma((verona *)&local_90,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          local_218._48_8_ =
               block[2].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1e0 = (element_type *)
                      block[2].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          if (local_1e0 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(local_1e0->symbols)._M_t._M_impl.super__Rb_tree_header;
              (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
              UNLOCK();
            }
            else {
              p_Var1 = &(local_1e0->symbols)._M_t._M_impl.super__Rb_tree_header;
              (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
            }
          }
          check((Infer *)block,&local_90,(Btype *)(local_218 + 0x30));
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
          in_XMM0_Da = extraout_XMM0_Da_02;
          in_XMM0_Db = extraout_XMM0_Db_02;
          if (local_1e0 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
            in_XMM0_Da = extraout_XMM0_Da_03;
            in_XMM0_Db = extraout_XMM0_Db_03;
          }
          if (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
            in_XMM0_Da = extraout_XMM0_Da_04;
            in_XMM0_Db = extraout_XMM0_Db_04;
          }
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
          if (local_1d0 != (NodeDef *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
            in_XMM0_Da = extraout_XMM0_Da_05;
            in_XMM0_Db = extraout_XMM0_Db_05;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_;
          }
          goto joined_r0x0022bcc8;
        }
        if (pTVar4 == (TokenDef *)Move) {
          if (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              *(element_type **)
               (*(_func_int **)((long)(((string *)local_218._24_8_)->_M_dataplus)._M_p + 0x60) +
               -0x10)) {
            __assert_fail("stmt == block->back()",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                          ,0x8e,"Node verona::Infer::do_block(Node &)");
          }
          if (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_218._32_8_ =
               local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_218._40_8_ =
               local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          gamma((verona *)local_268._40_8_,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_29;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._40_8_);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_30;
          }
          if (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_31;
          }
          if (!bVar11) goto LAB_0022c635;
          break;
        }
        local_2d8._0_8_ = Class;
        local_2d8._8_8_ = TypeAlias;
        local_2c8._0_8_ = LLVM;
        local_2c8._8_8_ = Drop;
        pTVar8 = ::std::
                 __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                           ((Lookup *)local_2d8,&local_2b8,
                            &(local_278.
                              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->type_);
        in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
        in_XMM0_Da = extraout_XMM0_Da;
        in_XMM0_Db = extraout_XMM0_Db;
        if (pTVar8 == &local_2b8) {
          __assert_fail("stmt->in({Class, TypeAlias, LLVM, Drop})",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                        ,0x93,"Node verona::Infer::do_block(Node &)");
        }
      }
      if (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_278.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_16;
        in_XMM0_Da = extraout_XMM0_Da_19;
        in_XMM0_Db = extraout_XMM0_Db_19;
      }
      p_Var9 = p_Var9 + 0x10;
      bVar11 = p_Var9 == p_Var10;
    } while (!bVar11);
  }
  (((enable_shared_from_this<trieste::NodeDef> *)local_268._40_8_)->_M_weak_this).
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (((enable_shared_from_this<trieste::NodeDef> *)local_268._40_8_)->_M_weak_this).
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0022c635:
  NVar12.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  NVar12.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_268._40_8_;
  return (Node)NVar12.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node do_block(Node& block)
    {
      for (auto stmt : *block)
      {
        if (stmt == Bind)
        {
          // TODO: literals
          auto rhs = stmt / Rhs;
          auto type = make_btype(stmt / Type);

          if (rhs == TypeTest)
            check(bool_type, type);
          else if (rhs == Cast)
            check(rhs / Type, type);
          else if (rhs->in({Move, Copy}))
            check(gamma(rhs), type);
          else if (rhs == FieldRef)
          {
            // TODO: Self substitution?
            // this is failing when `type` is a TypeVar, unclear why
            check(
              TypeView << -gamma(rhs / Ref)
                       << reftype(
                            cls->lookdown((rhs / Ident)->location()).front() /
                            Type),
              type);
          }
          else if (rhs == Conditional)
          {
            check(gamma(rhs / If), bool_type);
            check(do_block(rhs / True), type);
            check(do_block(rhs / False), type);
          }
          else if (rhs == Call)
          {
            auto sel = rhs / Selector;

            if (sel == FQFunction)
            {
              // TODO: may not have a function of this arity
              auto l = resolve_fq(sel);
              auto params = clone(l.def / Params);
              auto ret = clone(l.def / Type);
              auto args = rhs / Args;
              l.sub(params);
              l.sub(ret);

              (void)std::equal(
                params->begin(),
                params->end(),
                args->begin(),
                args->end(),
                [&](Node& param, Node& arg) {
                  check(gamma(arg), make_btype(param / Type));
                  return true;
                });

              check(ret, type);
            }
            else
            {
              // TODO: selector
            }
          }
          else if (rhs->in(
                     {Int,
                      Bin,
                      Oct,
                      Hex,
                      Float,
                      HexFloat,
                      Char,
                      Escaped,
                      String,
                      Tuple,
                      LLVM}))
          {
            // TODO:
          }
          else
          {
            assert(false);
          }
        }
        else if (stmt == Return)
        {
          assert(stmt == block->back());
          check(gamma(stmt / Ref), ret_type);
        }
        else if (stmt == Move)
        {
          assert(stmt == block->back());
          return gamma(stmt);
        }
        else
        {
          assert(stmt->in({Class, TypeAlias, LLVM, Drop}));
        }
      }

      return {};
    }